

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O3

void __thiscall Logger::Impl::formatTime(Impl *this)

{
  int iVar1;
  tm *__tp;
  size_t __n;
  char **ppcVar2;
  char *__dest;
  undefined1 local_58 [8];
  timeval tv;
  char str_t [26];
  time_t time;
  
  str_t[8] = '\0';
  str_t[9] = '\0';
  str_t[10] = '\0';
  str_t[0xb] = '\0';
  str_t[0xc] = '\0';
  str_t[0xd] = '\0';
  str_t[0xe] = '\0';
  str_t[0xf] = '\0';
  str_t[0x10] = '\0';
  str_t[0x11] = '\0';
  tv.tv_usec = 0;
  str_t[0] = '\0';
  str_t[1] = '\0';
  str_t[2] = '\0';
  str_t[3] = '\0';
  str_t[4] = '\0';
  str_t[5] = '\0';
  str_t[6] = '\0';
  str_t[7] = '\0';
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  stack0xffffffffffffffd8 = (__time_t)local_58;
  __tp = localtime((time_t *)(str_t + 0x18));
  strftime((char *)&tv.tv_usec,0x1a,"%Y-%m-%d %H:%M:%S\n",__tp);
  __n = strlen((char *)&tv.tv_usec);
  __dest = (this->stream_).buffer_.cur_;
  ppcVar2 = &(this->stream_).buffer_.cur_;
  iVar1 = (int)ppcVar2 - (int)__dest;
  if ((int)__n < iVar1) {
    memcpy(__dest,&tv.tv_usec,__n);
    __dest = *ppcVar2 + __n;
    *ppcVar2 = __dest;
    iVar1 = (int)ppcVar2 - (int)__dest;
  }
  if (0x1a < iVar1) {
    builtin_strncpy(__dest,"+-----------------------+\n",0x1a);
    *ppcVar2 = *ppcVar2 + 0x1a;
  }
  return;
}

Assistant:

void Logger::Impl::formatTime()
{
    struct timeval tv;
    time_t time;
    char str_t[26] = {0};
    gettimeofday (&tv, NULL);
    time = tv.tv_sec;
    struct tm* p_time = localtime(&time);   
    strftime(str_t, 26, "%Y-%m-%d %H:%M:%S\n", p_time);
    stream_ << str_t;
    stream_ << "+-----------------------+\n";

}